

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

adt_str_encoding_t adt_utf8_checkEncodingAndSize(uint8_t *strBuf,int32_t maxBufLen,int32_t *strSize)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  if (strSize == (int32_t *)0x0) {
    return '\0';
  }
  bVar2 = 1;
  if (-1 < maxBufLen) {
    lVar3 = 0;
    do {
      bVar1 = strBuf[lVar3];
      if (bVar1 == 0) break;
      if ((bVar2 == 1) && ((char)bVar1 < '\0')) {
        bVar2 = ((bVar1 & 0xe0) == 0xc0 || ((bVar1 & 0xf0) == 0xe0 || (bVar1 & 0xf8) == 0xf0)) ^ 3;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 < maxBufLen || maxBufLen == 0);
  }
  *strSize = (int32_t)lVar3;
  return bVar2;
}

Assistant:

DYN_STATIC adt_str_encoding_t adt_utf8_checkEncodingAndSize(const uint8_t *strBuf, int32_t maxBufLen, int32_t *strSize)
{
   if ( (strBuf == 0) || (maxBufLen < 0) || (strSize == 0) )
   {
      return ADT_STR_ENCODING_UNKNOWN;
   }
   const uint8_t *p = strBuf;
   uint8_t c = 0;
   adt_str_encoding_t retval = ADT_STR_ENCODING_ASCII;
   int32_t size = 0;
   while( (maxBufLen == 0) || (size < maxBufLen))
   {
      c = *p++;
      if (c == 0)
      {
         break;
      }
      else if ( (retval == ADT_STR_ENCODING_ASCII) && (c > 127) )
      {
         if ( ( (c & 0xf8) == 0xf0) || ( (c & 0xf0) == 0xe0) || ( (c & 0xe0) == 0xc0) )
         {
            retval = ADT_STR_ENCODING_UTF8;
         }
         else
         {
            retval = ADT_STR_ENCODING_UTF16; //this is a guess
         }
      }
      size++;
   }
   *strSize = size;
   return retval;
}